

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<long_long,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  uint uVar2;
  format_specs *pfVar3;
  bool bVar4;
  bin_writer<1> f;
  int num_digits;
  unsigned_type uVar5;
  string_view prefix;
  undefined4 uStack_4;
  
  pfVar3 = this->specs;
  if ((char)pfVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pfVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar5 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar4 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar4);
  prefix.data_ = this->prefix;
  f._12_4_ = uStack_4;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              *)this->writer,num_digits,prefix,*pfVar3,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }